

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O1

void __thiscall Spi::flash_prog(Spi *this,int addr,uint8_t *data,int n)

{
  uint8_t command [4];
  uint8_t local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  if (this->verbose == true) {
    fprintf(_stdout,"prog 0x%06X +0x%03X..\n",addr,(ulong)(uint)n);
  }
  local_2c = '\x02';
  local_2b = (undefined1)((uint)addr >> 0x10);
  local_2a = (undefined1)((uint)addr >> 8);
  local_29 = (undefined1)addr;
  set_gpio(this,0,0);
  send_spi(this,&local_2c,4);
  send_spi(this,data,n);
  set_gpio(this,1,0);
  if ((0 < n) && (this->verbose != false)) {
    flash_prog();
  }
  return;
}

Assistant:

void Spi::flash_prog(int addr, uint8_t *data, int n) {
	if (verbose)
		fprintf(stdout, "prog 0x%06X +0x%03X..\n", addr, n);

	uint8_t command[4] = { FC_PP, (uint8_t) (addr >> 16), (uint8_t) (addr >> 8),
			(uint8_t) addr };

	flash_chip_select();
	send_spi(command, 4);
	send_spi(data, n);
	flash_chip_deselect();

	if (verbose)
		for (int i = 0; i < n; i++)
			fprintf(stderr, "%02x%c", data[i],
					i == n - 1 || i % 32 == 31 ? '\n' : ' ');
}